

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::GetNumBindingsUsedByType
          (DescriptorScalarReplacement *this,uint32_t type_id)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  DefUseManager *pDVar4;
  Instruction *this_00;
  ConstantManager *this_01;
  Constant *this_02;
  uint32_t sum;
  int iVar5;
  int iVar6;
  uint32_t i;
  uint index;
  
  iVar6 = 1;
  while( true ) {
    pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
    this_00 = analysis::DefUseManager::GetDef(pDVar4,type_id);
    OVar3 = this_00->opcode_;
    if (OVar3 == OpTypePointer) {
      uVar2 = Instruction::GetSingleWordInOperand(this_00,1);
      pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
      this_00 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
      OVar3 = this_00->opcode_;
    }
    if (OVar3 != OpTypeArray) break;
    type_id = Instruction::GetSingleWordInOperand(this_00,0);
    uVar2 = Instruction::GetSingleWordInOperand(this_00,1);
    this_01 = IRContext::get_constant_mgr((this->super_Pass).context_);
    this_02 = analysis::ConstantManager::FindDeclaredConstant(this_01,uVar2);
    if (this_02 == (Constant *)0x0) {
      __assert_fail("length_const != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                    ,0x17c,
                    "uint32_t spvtools::opt::DescriptorScalarReplacement::GetNumBindingsUsedByType(uint32_t)"
                   );
    }
    uVar2 = analysis::Constant::GetU32(this_02);
    iVar6 = iVar6 * uVar2;
  }
  if (OVar3 == OpTypeStruct) {
    bVar1 = descsroautil::IsTypeOfStructuredBuffer((this->super_Pass).context_,this_00);
    if (!bVar1) {
      iVar5 = 0;
      index = 0;
      while( true ) {
        uVar2 = Instruction::NumInOperands(this_00);
        if (uVar2 <= index) break;
        uVar2 = Instruction::GetSingleWordInOperand(this_00,index);
        uVar2 = GetNumBindingsUsedByType(this,uVar2);
        iVar5 = iVar5 + uVar2;
        index = index + 1;
      }
      goto LAB_004de73b;
    }
  }
  iVar5 = 1;
LAB_004de73b:
  return iVar5 * iVar6;
}

Assistant:

uint32_t DescriptorScalarReplacement::GetNumBindingsUsedByType(
    uint32_t type_id) {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);

  // If it's a pointer, look at the underlying type.
  if (type_inst->opcode() == spv::Op::OpTypePointer) {
    type_id = type_inst->GetSingleWordInOperand(1);
    type_inst = get_def_use_mgr()->GetDef(type_id);
  }

  // Arrays consume N*M binding numbers where N is the array length, and M is
  // the number of bindings used by each array element.
  if (type_inst->opcode() == spv::Op::OpTypeArray) {
    uint32_t element_type_id = type_inst->GetSingleWordInOperand(0);
    uint32_t length_id = type_inst->GetSingleWordInOperand(1);
    const analysis::Constant* length_const =
        context()->get_constant_mgr()->FindDeclaredConstant(length_id);
    // OpTypeArray's length must always be a constant
    assert(length_const != nullptr);
    uint32_t num_elems = length_const->GetU32();
    return num_elems * GetNumBindingsUsedByType(element_type_id);
  }

  // The number of bindings consumed by a structure is the sum of the bindings
  // used by its members.
  if (type_inst->opcode() == spv::Op::OpTypeStruct &&
      !descsroautil::IsTypeOfStructuredBuffer(context(), type_inst)) {
    uint32_t sum = 0;
    for (uint32_t i = 0; i < type_inst->NumInOperands(); i++)
      sum += GetNumBindingsUsedByType(type_inst->GetSingleWordInOperand(i));
    return sum;
  }

  // All other types are considered to take up 1 binding number.
  return 1;
}